

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsPublicationPublishComplexVector
               (HelicsPublication pub,double *vectorInput,int vectorLength,HelicsError *err)

{
  PublicationObject *pPVar1;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  pPVar1 = anon_unknown.dwarf_694c0::verifyPublication(pub,err);
  if (pPVar1 != (PublicationObject *)0x0) {
    if (vectorInput == (double *)0x0 || vectorLength < 1) {
      local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      helics::Publication::publish
                (pPVar1->pubPtr,(vector<double,_std::allocator<double>_> *)&local_38);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
    }
    else {
      helics::Publication::publishComplex(pPVar1->pubPtr,vectorInput,vectorLength);
    }
  }
  return;
}

Assistant:

void helicsPublicationPublishComplexVector(HelicsPublication pub, const double* vectorInput, int vectorLength, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        if ((vectorInput == nullptr) || (vectorLength <= 0)) {
            pubObj->pubPtr->publish(std::vector<double>());
        } else {
            pubObj->pubPtr->publishComplex(vectorInput, vectorLength);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}